

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall
backend::codegen::RegAllocator::replace_write::anon_class_16_2_94732020::operator()
          (anon_class_16_2_94732020 *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Function *function;
  ostream *__s;
  ostream *poVar1;
  Function *pFVar2;
  long in_RDI;
  size_t in_stack_fffffffffffffd68;
  Function *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  Function *in_stack_fffffffffffffd80;
  Function *in_stack_fffffffffffffd98;
  ostream *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  allocator<char> local_209;
  Timestamp *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  allocator<char> local_1e1;
  string local_1e0 [72];
  Severity *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  time_point_sys_clock local_168;
  Timestamp local_160;
  ostream local_148 [54];
  undefined1 local_112;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [120];
  time_point_sys_clock local_70;
  Timestamp local_68 [3];
  undefined1 local_9;
  
  local_9 = 0;
  AixLog::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  AixLog::Tag::Tag((Tag *)0x241b4f);
  AixLog::operator<<(in_stack_fffffffffffffda0,(Tag *)in_stack_fffffffffffffd98);
  local_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_68,&local_70);
  AixLog::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (allocator<char> *)in_stack_fffffffffffffda0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (allocator<char> *)in_stack_fffffffffffffda0);
  AixLog::Function::Function
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(string *)in_stack_fffffffffffffd70
             ,in_stack_fffffffffffffd68);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            AixLog::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  arm::display_reg_name(in_stack_fffffffffffffda0,(Reg)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  AixLog::Function::~Function(in_stack_fffffffffffffd70);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  AixLog::Timestamp::~Timestamp(local_68);
  AixLog::Tag::~Tag((Tag *)0x241cb0);
  local_112 = 0;
  function = (Function *)AixLog::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  poVar1 = local_148;
  AixLog::Tag::Tag((Tag *)0x241ce3);
  __s = AixLog::operator<<(poVar1,(Tag *)function);
  local_168.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(&local_160,&local_168);
  AixLog::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)poVar1);
  pFVar2 = (Function *)&local_209;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)poVar1);
  AixLog::Function::Function
            (pFVar2,in_stack_fffffffffffffd78,(string *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68);
  poVar1 = AixLog::operator<<(poVar1,function);
  pFVar2 = (Function *)std::operator<<(poVar1," at: ");
  poVar1 = (ostream *)std::ostream::operator<<(pFVar2,**(int **)(in_RDI + 8));
  std::operator<<(poVar1," ");
  AixLog::Function::~Function(pFVar2);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  AixLog::Timestamp::~Timestamp(&local_160);
  AixLog::Tag::~Tag((Tag *)0x241e6d);
  return;
}

Assistant:

void RegAllocator::replace_write(ReplaceWriteAction r, int i) {
  auto disp_reg = [&]() {
    display_reg_name(LOG(TRACE), r.from);
    LOG(TRACE) << " at: " << i << " ";
  };
  if (r.kind == ReplaceWriteKind::Phys) {
    // is physical register; mark as occupied
    active.insert({r.replace_with, Interval(i, UINT32_MAX)});
    disp_reg();
    LOG(TRACE) << "phys " << r.replace_with << std::endl;
    return;
  } else if (r.kind == ReplaceWriteKind::Graph) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph" << std::endl;
  } else if (r.kind == ReplaceWriteKind::Spill) {
    // this register is allocated in stack
    Reg rd = r.replace_with;
    int pos = get_or_alloc_spill_pos(r.from);

    bool del = false;
    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x__->r1 == rd &&
            x_->cond == cur_cond &&
            (*x__) == MemoryOperand(REG_SP, pos + stack_offset)) {
          del = true;
        }
      }
    }
    if (!del) {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::StR, rd, MemoryOperand(REG_SP, pos + stack_offset),
          cur_cond));
    }
    wrote_to.erase(r.from);
    disp_reg();
    LOG(TRACE) << "spill " << pos << " " << del << std::endl;
  } else {
    disp_reg();
    LOG(TRACE) << "temp" << std::endl;
    // Is temporary register
    // the register should already be written to or read from

    // throw new std::logic_error("Writing to transient register");
  }
}